

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd_int8.h
# Opt level: O0

void ncnn::pack_A_tile_int8(Mat *A,Mat *AT,int batch,int max_ii,int max_kk)

{
  int iVar1;
  int local_a4;
  undefined2 *local_a0;
  int local_94;
  undefined2 *local_90;
  int local_84;
  undefined2 *puStack_80;
  int kk_3;
  short *p0_3;
  undefined2 *puStack_70;
  int kk_2;
  short *p0_2;
  undefined2 *puStack_60;
  int kk_1;
  short *p0_1;
  int kk;
  short *p0;
  int ii;
  short *pp;
  int b;
  int N;
  int max_kk_local;
  int max_ii_local;
  int batch_local;
  Mat *AT_local;
  Mat *A_local;
  
  iVar1 = max_kk * batch;
  for (p0_1._4_4_ = 0; p0_1._4_4_ < batch; p0_1._4_4_ = p0_1._4_4_ + 1) {
    puStack_60 = (undefined2 *)((long)AT->data + (long)AT->w * (long)p0_1._4_4_ * AT->elemsize);
    for (p0_2._4_4_ = 0; p0_2._4_4_ + 7 < max_ii; p0_2._4_4_ = p0_2._4_4_ + 8) {
      puStack_70 = (undefined2 *)
                   ((long)A->data + (long)p0_1._4_4_ * 2 + (long)(p0_2._4_4_ * iVar1) * 2);
      for (p0_3._4_4_ = 0; p0_3._4_4_ + 1 < max_kk; p0_3._4_4_ = p0_3._4_4_ + 2) {
        *puStack_60 = *puStack_70;
        puStack_60[1] = puStack_70[batch];
        puStack_60[2] = puStack_70[iVar1];
        puStack_60[3] = puStack_70[iVar1 + batch];
        puStack_60[4] = puStack_70[iVar1 * 2];
        puStack_60[5] = puStack_70[iVar1 * 2 + batch];
        puStack_60[6] = puStack_70[iVar1 * 3];
        puStack_60[7] = puStack_70[iVar1 * 3 + batch];
        puStack_60[8] = puStack_70[iVar1 * 4];
        puStack_60[9] = puStack_70[iVar1 * 4 + batch];
        puStack_60[10] = puStack_70[iVar1 * 5];
        puStack_60[0xb] = puStack_70[iVar1 * 5 + batch];
        puStack_60[0xc] = puStack_70[iVar1 * 6];
        puStack_60[0xd] = puStack_70[iVar1 * 6 + batch];
        puStack_60[0xe] = puStack_70[iVar1 * 7];
        puStack_60[0xf] = puStack_70[iVar1 * 7 + batch];
        puStack_70 = puStack_70 + (batch << 1);
        puStack_60 = puStack_60 + 0x10;
      }
      for (; p0_3._4_4_ < max_kk; p0_3._4_4_ = p0_3._4_4_ + 1) {
        *puStack_60 = *puStack_70;
        puStack_60[1] = puStack_70[iVar1];
        puStack_60[2] = puStack_70[iVar1 * 2];
        puStack_60[3] = puStack_70[iVar1 * 3];
        puStack_60[4] = puStack_70[iVar1 * 4];
        puStack_60[5] = puStack_70[iVar1 * 5];
        puStack_60[6] = puStack_70[iVar1 * 6];
        puStack_60[7] = puStack_70[iVar1 * 7];
        puStack_70 = puStack_70 + batch;
        puStack_60 = puStack_60 + 8;
      }
    }
    for (; p0_2._4_4_ + 3 < max_ii; p0_2._4_4_ = p0_2._4_4_ + 4) {
      puStack_80 = (undefined2 *)
                   ((long)A->data + (long)p0_1._4_4_ * 2 + (long)(p0_2._4_4_ * iVar1) * 2);
      for (local_84 = 0; local_84 + 1 < max_kk; local_84 = local_84 + 2) {
        *puStack_60 = *puStack_80;
        puStack_60[1] = puStack_80[batch];
        puStack_60[2] = puStack_80[iVar1];
        puStack_60[3] = puStack_80[iVar1 + batch];
        puStack_60[4] = puStack_80[iVar1 * 2];
        puStack_60[5] = puStack_80[iVar1 * 2 + batch];
        puStack_60[6] = puStack_80[iVar1 * 3];
        puStack_60[7] = puStack_80[iVar1 * 3 + batch];
        puStack_80 = puStack_80 + (batch << 1);
        puStack_60 = puStack_60 + 8;
      }
      for (; local_84 < max_kk; local_84 = local_84 + 1) {
        *puStack_60 = *puStack_80;
        puStack_60[1] = puStack_80[iVar1];
        puStack_60[2] = puStack_80[iVar1 * 2];
        puStack_60[3] = puStack_80[iVar1 * 3];
        puStack_80 = puStack_80 + batch;
        puStack_60 = puStack_60 + 4;
      }
    }
    for (; p0_2._4_4_ + 1 < max_ii; p0_2._4_4_ = p0_2._4_4_ + 2) {
      local_90 = (undefined2 *)
                 ((long)A->data + (long)p0_1._4_4_ * 2 + (long)(p0_2._4_4_ * iVar1) * 2);
      for (local_94 = 0; local_94 + 1 < max_kk; local_94 = local_94 + 2) {
        *puStack_60 = *local_90;
        puStack_60[1] = local_90[batch];
        puStack_60[2] = local_90[iVar1];
        puStack_60[3] = local_90[iVar1 + batch];
        local_90 = local_90 + (batch << 1);
        puStack_60 = puStack_60 + 4;
      }
      for (; local_94 < max_kk; local_94 = local_94 + 1) {
        *puStack_60 = *local_90;
        puStack_60[1] = local_90[iVar1];
        local_90 = local_90 + batch;
        puStack_60 = puStack_60 + 2;
      }
    }
    for (; p0_2._4_4_ < max_ii; p0_2._4_4_ = p0_2._4_4_ + 1) {
      local_a0 = (undefined2 *)
                 ((long)A->data + (long)p0_1._4_4_ * 2 + (long)(p0_2._4_4_ * iVar1) * 2);
      for (local_a4 = 0; local_a4 < max_kk; local_a4 = local_a4 + 1) {
        *puStack_60 = *local_a0;
        local_a0 = local_a0 + batch;
        puStack_60 = puStack_60 + 1;
      }
    }
  }
  return;
}

Assistant:

static void pack_A_tile_int8(const Mat& A, Mat& AT, int batch, int max_ii, int max_kk)
{
    const int N = max_kk * batch;

    for (int b = 0; b < batch; b++)
    {
        short* pp = AT.row<short>(b);

        int ii = 0;
#if __SSE2__
#if __AVX2__
#if __AVX512F__
        for (; ii + 15 < max_ii; ii += 16)
        {
            const short* p0 = (const short*)A + ii * N + b;

            int kk = 0;
            for (; kk + 1 < max_kk; kk += 2)
            {
                pp[0] = p0[0];
                pp[1] = p0[batch];
                pp[2] = p0[N];
                pp[3] = p0[N + batch];
                pp[4] = p0[N * 2];
                pp[5] = p0[N * 2 + batch];
                pp[6] = p0[N * 3];
                pp[7] = p0[N * 3 + batch];
                pp[8] = p0[N * 4];
                pp[9] = p0[N * 4 + batch];
                pp[10] = p0[N * 5];
                pp[11] = p0[N * 5 + batch];
                pp[12] = p0[N * 6];
                pp[13] = p0[N * 6 + batch];
                pp[14] = p0[N * 7];
                pp[15] = p0[N * 7 + batch];
                pp[16] = p0[N * 8];
                pp[17] = p0[N * 8 + batch];
                pp[18] = p0[N * 9];
                pp[19] = p0[N * 9 + batch];
                pp[20] = p0[N * 10];
                pp[21] = p0[N * 10 + batch];
                pp[22] = p0[N * 11];
                pp[23] = p0[N * 11 + batch];
                pp[24] = p0[N * 12];
                pp[25] = p0[N * 12 + batch];
                pp[26] = p0[N * 13];
                pp[27] = p0[N * 13 + batch];
                pp[28] = p0[N * 14];
                pp[29] = p0[N * 14 + batch];
                pp[30] = p0[N * 15];
                pp[31] = p0[N * 15 + batch];
                p0 += batch * 2;
                pp += 32;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[N];
                pp[2] = p0[N * 2];
                pp[3] = p0[N * 3];
                pp[4] = p0[N * 4];
                pp[5] = p0[N * 5];
                pp[6] = p0[N * 6];
                pp[7] = p0[N * 7];
                pp[8] = p0[N * 8];
                pp[9] = p0[N * 9];
                pp[10] = p0[N * 10];
                pp[11] = p0[N * 11];
                pp[12] = p0[N * 12];
                pp[13] = p0[N * 13];
                pp[14] = p0[N * 14];
                pp[15] = p0[N * 15];
                p0 += batch;
                pp += 16;
            }
        }
#endif // __AVX512F__
        for (; ii + 7 < max_ii; ii += 8)
        {
            const short* p0 = (const short*)A + ii * N + b;

            int kk = 0;
            for (; kk + 1 < max_kk; kk += 2)
            {
                pp[0] = p0[0];
                pp[1] = p0[batch];
                pp[2] = p0[N];
                pp[3] = p0[N + batch];
                pp[4] = p0[N * 2];
                pp[5] = p0[N * 2 + batch];
                pp[6] = p0[N * 3];
                pp[7] = p0[N * 3 + batch];
                pp[8] = p0[N * 4];
                pp[9] = p0[N * 4 + batch];
                pp[10] = p0[N * 5];
                pp[11] = p0[N * 5 + batch];
                pp[12] = p0[N * 6];
                pp[13] = p0[N * 6 + batch];
                pp[14] = p0[N * 7];
                pp[15] = p0[N * 7 + batch];
                p0 += batch * 2;
                pp += 16;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[N];
                pp[2] = p0[N * 2];
                pp[3] = p0[N * 3];
                pp[4] = p0[N * 4];
                pp[5] = p0[N * 5];
                pp[6] = p0[N * 6];
                pp[7] = p0[N * 7];
                p0 += batch;
                pp += 8;
            }
        }
#endif // __AVX2__
        for (; ii + 3 < max_ii; ii += 4)
        {
            const short* p0 = (const short*)A + ii * N + b;

            int kk = 0;
            for (; kk + 1 < max_kk; kk += 2)
            {
                pp[0] = p0[0];
                pp[1] = p0[batch];
                pp[2] = p0[N];
                pp[3] = p0[N + batch];
                pp[4] = p0[N * 2];
                pp[5] = p0[N * 2 + batch];
                pp[6] = p0[N * 3];
                pp[7] = p0[N * 3 + batch];
                p0 += batch * 2;
                pp += 8;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[N];
                pp[2] = p0[N * 2];
                pp[3] = p0[N * 3];
                p0 += batch;
                pp += 4;
            }
        }
#endif // __SSE2__
        for (; ii + 1 < max_ii; ii += 2)
        {
            const short* p0 = (const short*)A + ii * N + b;

            int kk = 0;
            for (; kk + 1 < max_kk; kk += 2)
            {
                pp[0] = p0[0];
                pp[1] = p0[batch];
                pp[2] = p0[N];
                pp[3] = p0[N + batch];
                p0 += batch * 2;
                pp += 4;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[N];
                p0 += batch;
                pp += 2;
            }
        }
        for (; ii < max_ii; ii++)
        {
            const short* p0 = (const short*)A + ii * N + b;

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                p0 += batch;
                pp += 1;
            }
        }
    }
}